

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

string * GGSock::Communicator::getLocalAddress_abi_cxx11_(void)

{
  int iVar1;
  char *pcVar2;
  string *in_RDI;
  char buf [16];
  socklen_t addrlen;
  sockaddr_in loopback;
  int sock;
  allocator local_4a;
  allocator local_49;
  char local_48 [19];
  allocator local_35;
  socklen_t local_34;
  allocator local_2d [16];
  allocator local_1d;
  sockaddr local_1c;
  int local_c;
  
  local_c = socket(2,2,0);
  if (local_c == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    memset(&local_1c,0,0x10);
    local_1c.sa_family = 2;
    local_1c.sa_data[2] = '\x01';
    local_1c.sa_data[3] = '\0';
    local_1c.sa_data[4] = '\0';
    local_1c.sa_data[5] = '\x7f';
    local_1c.sa_data._0_2_ = htons(9);
    iVar1 = ::connect(local_c,&local_1c,0x10);
    if (iVar1 == -1) {
      close(local_c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
    }
    else {
      local_34 = 0x10;
      iVar1 = getsockname(local_c,&local_1c,&local_34);
      if (iVar1 == -1) {
        close(local_c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(in_RDI,"",&local_35);
        std::allocator<char>::~allocator((allocator<char> *)&local_35);
      }
      else {
        close(local_c);
        pcVar2 = inet_ntop(2,local_1c.sa_data + 2,local_48,0x10);
        if (pcVar2 == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(in_RDI,"",&local_49);
          std::allocator<char>::~allocator((allocator<char> *)&local_49);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(in_RDI,local_48,&local_4a);
          std::allocator<char>::~allocator((allocator<char> *)&local_4a);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

TAddress Communicator::getLocalAddress() {
        int sock = socket(PF_INET, SOCK_DGRAM, 0);
        sockaddr_in loopback;

        if (sock == -1) {
            return "";
        }

        std::memset(&loopback, 0, sizeof(loopback));
        loopback.sin_family = AF_INET;
        loopback.sin_addr.s_addr = INADDR_LOOPBACK;   // using loopback ip address
        loopback.sin_port = htons(9);                 // using debug port

        if (::connect(sock, reinterpret_cast<sockaddr*>(&loopback), sizeof(loopback)) == -1) {
            close(sock);
            return "";
        }

        socklen_t addrlen = sizeof(loopback);
        if (getsockname(sock, reinterpret_cast<sockaddr*>(&loopback), &addrlen) == -1) {
            close(sock);
            return "";
        }

        close(sock);

        char buf[INET_ADDRSTRLEN];
        if (inet_ntop(AF_INET, &loopback.sin_addr, buf, INET_ADDRSTRLEN) == 0x0) {
            return "";
        }

        return buf;
    }